

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O1

ArgIface * __thiscall Args::Arg::findArgument(Arg *this,String *name)

{
  long lVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  String local_58;
  String local_40;
  
  String::String(&local_58,"--");
  iVar2 = QString::indexOf(&name->m_str,(longlong)&local_58,CaseInsensitive);
  if (&(local_58.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.m_str.d.d)->super_QArrayData,2,8);
    }
  }
  if (iVar2 == 0) {
    String::substr(&local_40,name,2,-1);
    lVar1 = (this->m_name).m_str.d.size;
    if (local_40.m_str.d.size != lVar1) goto LAB_00105d67;
    QVar5.m_data = local_40.m_str.d.ptr;
    QVar5.m_size = local_40.m_str.d.size;
    QVar7.m_data = (this->m_name).m_str.d.ptr;
    QVar7.m_size = lVar1;
    iVar3 = QtPrivate::compareStrings(QVar5,QVar7,CaseSensitive);
    bVar4 = iVar3 == 0;
  }
  else {
LAB_00105d67:
    bVar4 = false;
  }
  if ((iVar2 == 0) && (&(local_40.m_str.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_40.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.m_str.d.d)->super_QArrayData,2,8);
    }
  }
  if (bVar4) {
    return &this->super_ArgIface;
  }
  String::String(&local_58,"--");
  iVar2 = QString::indexOf(&name->m_str,(longlong)&local_58,CaseInsensitive);
  if (&(local_58.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.m_str.d.d)->super_QArrayData,2,8);
    }
  }
  if ((iVar2 == 0) ||
     (iVar2 = QString::indexOf((QChar)(char16_t)name,0x2d,CaseInsensitive), iVar2 != 0)) {
    bVar4 = false;
  }
  else {
    bVar4 = true;
  }
  if (bVar4) {
    String::substr(&local_58,name,1,-1);
    lVar1 = (this->m_flag).m_str.d.size;
    if (local_58.m_str.d.size == lVar1) {
      QVar6.m_data = local_58.m_str.d.ptr;
      QVar6.m_size = local_58.m_str.d.size;
      QVar8.m_data = (this->m_flag).m_str.d.ptr;
      QVar8.m_size = lVar1;
      iVar2 = QtPrivate::compareStrings(QVar6,QVar8,CaseSensitive);
      if (iVar2 != 0) {
        this = (Arg *)0x0;
      }
      goto LAB_00105e59;
    }
  }
  this = (Arg *)0x0;
LAB_00105e59:
  if ((bVar4) && (&(local_58.m_str.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_58.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.m_str.d.d)->super_QArrayData,2,8);
    }
  }
  return &this->super_ArgIface;
}

Assistant:

ArgIface * findArgument(
		/*!
			Name of the argument. Can be for example "-t" or
			"--timeout".
		*/
		const String & name ) override
	{
		if( details::isArgument( name ) && name.substr( 2 ) == m_name )
			return this;
		else if( details::isFlag( name ) && name.substr( 1 ) == m_flag )
			return this;
		else
			return nullptr;
	}